

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O1

void * gdImageGifPtr(gdImagePtr im,int *size)

{
  int iVar1;
  gdIOCtx *out;
  void *pvVar2;
  
  pvVar2 = (void *)0x0;
  out = gdNewDynamicCtx(0x800,(void *)0x0);
  if (out != (gdIOCtx *)0x0) {
    iVar1 = _gdImageGifCtx(im,out);
    if (iVar1 == 0) {
      pvVar2 = gdDPExtractData(out,size);
    }
    else {
      pvVar2 = (void *)0x0;
    }
    (*out->gd_free)(out);
  }
  return pvVar2;
}

Assistant:

BGD_DECLARE(void *) gdImageGifPtr(gdImagePtr im, int *size)
{
	void *rv;
	gdIOCtx *out = gdNewDynamicCtx(2048, NULL);
	if (out == NULL) return NULL;
	if (!_gdImageGifCtx(im, out)) {
		rv = gdDPExtractData(out, size);
	} else {
		rv = NULL;
	}
	out->gd_free(out);
	return rv;
}